

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O2

Ref<anurbs::Polyline<2L>_> __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::Polyline<2L>_>::replace_with_key
          (PythonDataType<anurbs::Model,_anurbs::Polyline<2L>_> *this,Model *self,string *key,
          Pointer<anurbs::Polyline<2L>_> *data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Polyline<2L>_> RVar1;
  __shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&data->super___shared_ptr<anurbs::Polyline<2L>,_(__gnu_cxx::_Lock_policy)2>);
  Model::replace<anurbs::Polyline<2l>>
            ((Model *)this,(string *)self,(Pointer<anurbs::Polyline<2L>_> *)key);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Polyline<2L>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Polyline<2L>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (Ref<anurbs::Polyline<2L>_>)
         RVar1.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::Polyline<2L>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ref<TData> replace_with_key(TModel& self, const std::string& key,
        Pointer<TData> data)
    {
        return self.template replace<TData>(key, data);
    }